

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isojoliet_bz2.c
# Opt level: O0

void test_read_format_isojoliet_bz2(void)

{
  archive *paVar1;
  char *unaff_retaddr;
  wchar_t in_stack_00000008;
  undefined4 in_stack_0000000c;
  char *in_stack_00000010;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  char *in_stack_00000048;
  void *in_stack_00000050;
  char *in_stack_000003d0;
  archive *in_stack_ffffffffffffffb8;
  archive *paVar2;
  char *pcVar3;
  archive_entry **ppaVar4;
  archive_entry *paVar5;
  archive_entry_conflict *entry;
  int64_t *piVar6;
  int n;
  archive *in_stack_ffffffffffffffc0;
  uint uVar8;
  archive *paVar7;
  size_t *s;
  archive *in_stack_ffffffffffffffc8;
  archive *_a;
  undefined4 in_stack_ffffffffffffffd0;
  wchar_t in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  wchar_t in_stack_ffffffffffffffe4;
  archive_entry *in_stack_fffffffffffffff0;
  
  extract_reference_file(in_stack_000003d0);
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb8);
  archive_read_support_filter_all(in_stack_ffffffffffffffb8);
  paVar2 = (archive *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,0,
                      (char *)0x17e085,in_stack_fffffffffffffff0);
  archive_read_support_format_all(paVar2);
  pcVar3 = (char *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,0,
                      (char *)0x17e0bd,in_stack_fffffffffffffff0);
  archive_read_set_option
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,pcVar3);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,0,
                      (char *)0x17e107,in_stack_fffffffffffffff0);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
  ppaVar4 = (archive_entry **)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,0,
                      (char *)0x17e149,in_stack_fffffffffffffff0);
  archive_read_next_header(in_stack_ffffffffffffffc0,ppaVar4);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,0,
                      (char *)0x17e186,in_stack_fffffffffffffff0);
  uVar8 = (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  archive_entry_pathname(paVar5);
  paVar7 = (archive *)((ulong)uVar8 << 0x20);
  assertion_equal_string
            ((char *)paVar1,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8,(char *)paVar7,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e20a,
                      in_stack_fffffffffffffff0);
  archive_entry_size(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e245,
                      in_stack_fffffffffffffff0);
  archive_entry_mtime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e280,
                      in_stack_fffffffffffffff0);
  archive_entry_mtime_nsec(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e2b8,
                      in_stack_fffffffffffffff0);
  archive_entry_ctime(in_stack_fffffffffffffff0);
  entry = (archive_entry_conflict *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e2f3,
                      in_stack_fffffffffffffff0);
  archive_entry_stat(entry);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e32f,
                      in_stack_fffffffffffffff0);
  archive_entry_uid(in_stack_fffffffffffffff0);
  piVar6 = (int64_t *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e367,
                      in_stack_fffffffffffffff0);
  archive_read_data_block
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (void **)in_stack_ffffffffffffffc8,(size_t *)paVar7,piVar6);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,(longlong)paVar1,
                      (char *)0x17e3b0,in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e3e4,
                      in_stack_fffffffffffffff0);
  archive_entry_is_encrypted(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e41d,
                      in_stack_fffffffffffffff0);
  archive_read_has_encrypted_entries(in_stack_ffffffffffffffc8);
  paVar2 = paVar1;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,(longlong)paVar1,
                      (char *)0x17e459,in_stack_fffffffffffffff0);
  archive_read_next_header(paVar7,(archive_entry **)paVar1);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e496,
                      in_stack_fffffffffffffff0);
  archive_entry_pathname(paVar5);
  paVar7 = (archive *)((ulong)paVar7 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar2,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8,(char *)paVar7,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e51a,
                      in_stack_fffffffffffffff0);
  archive_entry_size(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e555,
                      in_stack_fffffffffffffff0);
  archive_entry_mtime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e590,
                      in_stack_fffffffffffffff0);
  archive_entry_atime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e5cb,
                      in_stack_fffffffffffffff0);
  archive_entry_is_encrypted(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e604,
                      in_stack_fffffffffffffff0);
  archive_read_has_encrypted_entries(in_stack_ffffffffffffffc8);
  paVar1 = paVar2;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,(longlong)paVar2,
                      (char *)0x17e640,in_stack_fffffffffffffff0);
  archive_read_next_header(paVar7,(archive_entry **)paVar2);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar7,0,(char *)0x17e67d,
                      in_stack_fffffffffffffff0);
  archive_entry_pathname(paVar5);
  s = (size_t *)((ulong)paVar7 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar1,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8,(char *)s,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x17e701,
                      in_stack_fffffffffffffff0);
  archive_entry_hardlink(paVar5);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffc8,(char *)s,paVar5);
  archive_entry_size(in_stack_fffffffffffffff0);
  piVar6 = (int64_t *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x17e76f,
                      in_stack_fffffffffffffff0);
  archive_read_data_block
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (void **)in_stack_ffffffffffffffc8,s,piVar6);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x17e7b6,
                      in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x17e7ec,
                      in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x17e81c,
                      in_stack_fffffffffffffff0);
  ppaVar4 = (archive_entry **)0x6;
  paVar2 = (archive *)0x2e6187;
  _a = (archive *)0x0;
  assertion_equal_mem((char *)p,size._4_4_,(void *)offset,in_stack_00000010,
                      (void *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                      (size_t)refname,in_stack_00000048,in_stack_00000050);
  archive_read_next_header(paVar2,ppaVar4);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar2,0,(char *)0x17e8a4,in_stack_fffffffffffffff0);
  archive_entry_pathname(paVar5);
  pcVar3 = (char *)((ulong)paVar2 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar1,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)_a,pcVar3
             ,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,pcVar3,0,
                      (char *)0x17e928,in_stack_fffffffffffffff0);
  archive_entry_hardlink(paVar5);
  ppaVar4 = (archive_entry **)0x0;
  paVar7 = (archive *)((ulong)pcVar3 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar1,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)_a,
             (char *)paVar7,unaff_retaddr,in_stack_00000008);
  archive_entry_size_is_set(in_stack_fffffffffffffff0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,(char *)paVar7,ppaVar4);
  archive_read_next_header(paVar7,ppaVar4);
  paVar5 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,0,(char *)0x17e9e0,in_stack_fffffffffffffff0);
  archive_entry_pathname(paVar5);
  paVar7 = (archive *)((ulong)paVar7 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar1,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)_a,
             (char *)paVar7,unaff_retaddr,in_stack_00000008);
  archive_entry_size(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,0,(char *)0x17ea5f,in_stack_fffffffffffffff0);
  archive_entry_mtime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,0,(char *)0x17ea9a,in_stack_fffffffffffffff0);
  archive_entry_atime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,0,(char *)0x17ead5,in_stack_fffffffffffffff0);
  archive_entry_is_encrypted(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,0,(char *)0x17eb0e,in_stack_fffffffffffffff0);
  archive_read_has_encrypted_entries(_a);
  paVar2 = paVar1;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,(longlong)paVar1,(char *)0x17eb4a,in_stack_fffffffffffffff0);
  archive_read_next_header(paVar7,(archive_entry **)paVar1);
  n = 0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,0,(char *)0x17eb8a,in_stack_fffffffffffffff0);
  archive_filter_code(paVar7,n);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,0,(char *)0x17ebc8,in_stack_fffffffffffffff0);
  archive_read_close((archive *)0x17ebd2);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,(longlong)paVar2,(char *)0x17ec01,in_stack_fffffffffffffff0);
  archive_read_free((archive *)0x17ec0b);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar7,0,(char *)0x17ec39,in_stack_fffffffffffffff0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isojoliet_bz2)
{
	const char *refname = "test_read_format_iso_joliet.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_set_option(a, "iso9660", "rockridge", NULL));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* First entry is '.' root directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(86401, archive_entry_ctime(ae));
	assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
	assertEqualInt(0, archive_entry_uid(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("dir", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(86401, archive_entry_atime(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A regular file with two names ("hardlink" gets returned
	 * first, so it's not marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("hardlink",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assert(archive_entry_hardlink(ae) == NULL);
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(0, archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt(6, (int)size);
	assertEqualInt(0, offset);
	assertEqualMem(p, "hello\n", 6);

	/* Second name for the same regular file (this happens to be
	 * returned second, so does get marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("long-joliet-file-name.textfile",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("hardlink",
	    archive_entry_hardlink(ae));
	assert(!archive_entry_size_is_set(ae));

	/* A symlink to the regular file. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("symlink", archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualInt(172802, archive_entry_mtime(ae));
	assertEqualInt(172802, archive_entry_atime(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}